

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_utils.cpp
# Opt level: O1

Graph * multi_agent_planning::generateGraph
                  (Graph *__return_storage_ptr__,int numV,int numConnected,float prob,int cost)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  pointer num_vertices;
  no_property *pnVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  AdjList *g;
  pointer *ppsVar8;
  undefined8 *puVar9;
  pointer psVar10;
  undefined8 *puVar11;
  pointer psVar12;
  pointer psVar13;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  in_stack_fffffffffffffe88;
  small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>
  in_stack_fffffffffffffed0;
  pointer local_a8 [2];
  long local_98;
  double local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60 [7];
  undefined8 local_28;
  undefined8 uStack_20;
  
  num_vertices = (pointer)(long)numV;
  local_60[0] = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_a8[0] = (pointer)gen;
  local_a8[1] = num_vertices;
  local_98 = (long)numConnected;
  local_90 = (double)prob;
  local_88 = 0;
  local_80 = 1;
  local_78 = 0;
  local_70 = 0;
  local_68 = 1;
  ppsVar8 = local_a8;
  puVar9 = (undefined8 *)&stack0xfffffffffffffe88;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar9 = *ppsVar8;
    ppsVar8 = ppsVar8 + 1;
    puVar9 = puVar9 + 1;
  }
  puVar9 = local_60;
  puVar11 = (undefined8 *)&stack0xfffffffffffffed0;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar11 = *puVar9;
    puVar9 = puVar9 + 1;
    puVar11 = puVar11 + 1;
  }
  boost::
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
  ::
  vec_adj_list_impl<boost::small_world_iterator<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>>>
            ((vec_adj_list_impl<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
              *)__return_storage_ptr__,(vertices_size_type)num_vertices,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffed0);
  psVar12 = (pointer)0x1;
  pnVar4 = (no_property *)operator_new(1);
  (__return_storage_ptr__->m_property).px = pnVar4;
  psVar1 = (__return_storage_ptr__->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (__return_storage_ptr__->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)psVar2 - (long)psVar1 >> 5;
  if (psVar2 == psVar1) {
    lVar6 = 0;
    bVar3 = false;
  }
  else {
    psVar12 = (psVar1->super_StoredVertex).m_out_edges.
              super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    num_vertices = (psVar1->super_StoredVertex).m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    if (num_vertices == psVar12) {
      ppsVar8 = &psVar1[1].super_StoredVertex.m_out_edges.
                 super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = 0;
      do {
        if (lVar5 + -1 == lVar6) {
          bVar3 = false;
          lVar6 = lVar5;
          goto LAB_0012961c;
        }
        psVar12 = ((_Vector_impl_data *)(ppsVar8 + -1))->_M_start;
        num_vertices = *ppsVar8;
        ppsVar8 = ppsVar8 + 4;
        lVar6 = lVar6 + 1;
      } while (num_vertices == psVar12);
    }
    else {
      lVar6 = 0;
    }
    bVar3 = true;
  }
LAB_0012961c:
  if (lVar6 != lVar5) {
    do {
      if (!bVar3) {
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action> *, std::vector<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action> *, std::vector<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action> *, std::vector<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action> *, std::vector<boost::detail::stored_edge_property<unsigned long, multi_agent_planning::Action>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      ((psVar12->m_property)._M_t.
       super___uniq_ptr_impl<multi_agent_planning::Action,_std::default_delete<multi_agent_planning::Action>_>
       ._M_t.
       super__Tuple_impl<0UL,_multi_agent_planning::Action_*,_std::default_delete<multi_agent_planning::Action>_>
       .super__Head_base<0UL,_multi_agent_planning::Action_*,_false>._M_head_impl)->cost = cost;
      psVar13 = psVar12 + 1;
      lVar7 = lVar6;
      psVar10 = num_vertices;
      psVar12 = psVar13;
      if (psVar13 == num_vertices) {
        ppsVar8 = &psVar1[lVar6 + 1].super_StoredVertex.m_out_edges.
                   super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_multi_agent_planning::Action>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        do {
          lVar7 = lVar5;
          psVar10 = num_vertices;
          psVar12 = psVar13;
          if (lVar5 + -1 == lVar6) break;
          psVar12 = ((_Vector_impl_data *)(ppsVar8 + -1))->_M_start;
          psVar10 = *ppsVar8;
          ppsVar8 = ppsVar8 + 4;
          lVar6 = lVar6 + 1;
          lVar7 = lVar6;
        } while (psVar10 == psVar12);
      }
      lVar6 = lVar7;
      num_vertices = psVar10;
    } while (lVar7 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

Graph generateGraph(int numV, int numConnected, float prob, int cost) {
	Graph graph = Graph(SWGen(gen, numV, numConnected, prob, false), SWGen(), numV);
	for (Graph::edge_iterator eIt = edges(graph).first; eIt != edges(graph).second; ++eIt) {
		graph[*eIt].cost = cost;
	}

	return graph;
}